

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O3

bool __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                  time_point expire_time,allow a)

{
  _Rb_tree_header *p_Var1;
  list<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  ulong uVar2;
  _Base_ptr p_Var3;
  uint unaff_EBX;
  undefined1 uVar4;
  undefined7 uVar5;
  size_t __len;
  _Base_ptr p_Var6;
  
  uVar4 = (undefined1)a;
  uVar5 = (undefined7)(a >> 8);
  p_Var3 = (this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header;
    uVar2 = *key;
    p_Var6 = &p_Var1->_M_header;
    do {
      __len = (size_t)(*(ulong *)(p_Var3 + 1) < uVar2);
      if (*(ulong *)(p_Var3 + 1) >= uVar2) {
        p_Var6 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[__len];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(ulong *)(p_Var6 + 1) <= uVar2)) {
      if ((a & update) == 0) {
        return false;
      }
      std::__cxx11::string::operator=((string *)&p_Var6[1]._M_parent,(string *)value);
      p_Var3 = p_Var6[2]._M_parent;
      p_Var3->_M_left = (_Base_ptr)expire_time.__d.__r;
      this_00 = &this->m_ttl_list;
      std::__cxx11::
      list<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
      ::splice(this_00,(int)this_00,(__off64_t *)this_00,(int)p_Var3,
               (__off64_t *)CONCAT71(uVar5,uVar4),__len,unaff_EBX);
      p_Var6[2]._M_parent =
           (_Base_ptr)
           (this->m_ttl_list).
           super__List_base<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
      return true;
    }
  }
  if ((a & insert) == 0) {
    return false;
  }
  do_insert(this,key,value,expire_time);
  return true;
}

Assistant:

auto do_insert_update(
        const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), expire_time);
                return true;
            }
        }
        return false;
    }